

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int evthread_notify_base_eventfd(event_base *base)

{
  ssize_t sVar1;
  int *piVar2;
  uint64_t msg;
  
  msg = 1;
  do {
    sVar1 = write(base->th_notify_fd[0],&msg,8);
    if (-1 < (int)sVar1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 0xb);
  return (int)sVar1 >> 0x1f;
}

Assistant:

static int
evthread_notify_base_eventfd(struct event_base *base)
{
	ev_uint64_t msg = 1;
	int r;
	do {
		r = write(base->th_notify_fd[0], (void*) &msg, sizeof(msg));
	} while (r < 0 && errno == EAGAIN);

	return (r < 0) ? -1 : 0;
}